

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioWriteDot.c
# Opt level: O2

void Io_WriteDotNtk(Abc_Ntk_t *pNtk,Vec_Ptr_t *vNodes,Vec_Ptr_t *vNodesShow,char *pFileName,
                   int fGateNames,int fUseReverse)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  FILE *__stream;
  void *pvVar6;
  char *pcVar7;
  Abc_Obj_t *pAVar8;
  char *pcVar9;
  Mio_Gate_t *pGate;
  uint uVar10;
  ulong uVar11;
  Abc_Obj_t *pAVar12;
  uint uVar13;
  long lVar14;
  int local_5c;
  
  if ((pNtk->ntkType & ~ABC_NTK_NETLIST) != ABC_NTK_LOGIC) {
    pcVar7 = "Abc_NtkIsStrash(pNtk) || Abc_NtkIsLogic(pNtk)";
    uVar13 = 0x4f;
LAB_002eac59:
    __assert_fail(pcVar7,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/io/ioWriteDot.c"
                  ,uVar13,
                  "void Io_WriteDotNtk(Abc_Ntk_t *, Vec_Ptr_t *, Vec_Ptr_t *, char *, int, int)");
  }
  if (vNodes->nSize < 1) {
    pcVar7 = "The set has no nodes. DOT file is not written.";
LAB_002e9ed6:
    puts(pcVar7);
    return;
  }
  if (500 < (uint)vNodes->nSize) {
    printf("The set has more than %d nodes. DOT file is not written.\n",500);
    return;
  }
  __stream = fopen(pFileName,"w");
  if (__stream == (FILE *)0x0) {
    fprintf(_stdout,"Cannot open the intermediate file \"%s\".\n",pFileName);
    return;
  }
  bVar1 = true;
  if ((pNtk->ntkFunc == ABC_FUNC_BDD) && (pNtk->ntkType == ABC_NTK_LOGIC)) {
    iVar2 = Abc_NtkBddToSop(pNtk,-1,1000000000);
    if (iVar2 == 0) {
      pcVar7 = "Io_WriteDotNtk(): Converting to SOPs has failed.";
      goto LAB_002e9ed6;
    }
    bVar1 = false;
  }
  for (iVar2 = 0; iVar2 < vNodes->nSize; iVar2 = iVar2 + 1) {
    pvVar6 = Vec_PtrEntry(vNodes,iVar2);
    *(byte *)((long)pvVar6 + 0x14) = *(byte *)((long)pvVar6 + 0x14) | 0x40;
  }
  if (vNodesShow != (Vec_Ptr_t *)0x0) {
    for (iVar2 = 0; iVar2 < vNodesShow->nSize; iVar2 = iVar2 + 1) {
      pvVar6 = Vec_PtrEntry(vNodesShow,iVar2);
      *(byte *)((long)pvVar6 + 0x14) = *(byte *)((long)pvVar6 + 0x14) | 0x20;
    }
  }
  iVar2 = Abc_NtkLevel(pNtk);
  if (fUseReverse != 0) {
    iVar3 = Abc_NtkLevelReverse(pNtk);
    if (iVar2 != iVar3) {
      pcVar7 = "LevelMax == LevelMin";
      uVar13 = 0x7a;
      goto LAB_002eac59;
    }
    for (iVar3 = 0; iVar3 < vNodes->nSize; iVar3 = iVar3 + 1) {
      pvVar6 = Vec_PtrEntry(vNodes,iVar3);
      uVar13 = *(uint *)((long)pvVar6 + 0x14);
      if ((uVar13 & 0xf) == 7) {
        *(uint *)((long)pvVar6 + 0x14) =
             (uVar13 & 0xff7) + (iVar2 - (uVar13 >> 0xc)) * 0x1000 + 0x1000;
      }
    }
  }
  local_5c = 0;
  uVar13 = 0xffffffff;
  uVar5 = 10000;
  for (iVar2 = 0; iVar3 = vNodes->nSize, iVar2 < iVar3; iVar2 = iVar2 + 1) {
    pvVar6 = Vec_PtrEntry(vNodes,iVar2);
    if ((*(uint *)((long)pvVar6 + 0x14) & 0xf) - 5 < 0xfffffffe) {
      uVar4 = *(uint *)((long)pvVar6 + 0x14) >> 0xc;
      if (uVar4 <= uVar5) {
        uVar5 = uVar4;
      }
      if ((int)uVar13 <= (int)uVar4) {
        uVar13 = uVar4;
      }
    }
    else {
      local_5c = 1;
    }
  }
  if (local_5c != 0) {
    uVar13 = uVar13 + 1;
    for (iVar2 = 0; iVar2 < iVar3; iVar2 = iVar2 + 1) {
      pvVar6 = Vec_PtrEntry(vNodes,iVar2);
      if (0xfffffffd < (*(uint *)((long)pvVar6 + 0x14) & 0xf) - 5) {
        *(uint *)((long)pvVar6 + 0x14) = *(uint *)((long)pvVar6 + 0x14) & 0xfff | uVar13 * 0x1000;
      }
      iVar3 = vNodes->nSize;
    }
  }
  fprintf(__stream,"# %s\n","Network structure generated by ABC");
  fputc(10,__stream);
  fwrite("digraph network {\n",0x12,1,__stream);
  fwrite("size = \"7.5,10\";\n",0x11,1,__stream);
  fwrite("center = true;\n",0xf,1,__stream);
  fwrite("edge [dir = back];\n",0x13,1,__stream);
  fputc(10,__stream);
  fwrite("{\n",2,1,__stream);
  fwrite("  node [shape = plaintext];\n",0x1c,1,__stream);
  fwrite("  edge [style = invis];\n",0x18,1,__stream);
  fwrite("  LevelTitle1 [label=\"\"];\n",0x1a,1,__stream);
  fwrite("  LevelTitle2 [label=\"\"];\n",0x1a,1,__stream);
  for (uVar4 = uVar13; (int)uVar5 <= (int)uVar4; uVar4 = uVar4 - 1) {
    fprintf(__stream,"  Level%d",(ulong)uVar4);
    fwrite(" [label = ",10,1,__stream);
    fputc(0x22,__stream);
    fputc(0x22,__stream);
    fwrite("];\n",3,1,__stream);
  }
  fwrite("  LevelTitle1 ->  LevelTitle2 ->",0x20,1,__stream);
  for (uVar4 = uVar13; (int)uVar5 <= (int)uVar4; uVar4 = uVar4 - 1) {
    fprintf(__stream,"  Level%d",(ulong)uVar4);
    if (uVar5 == uVar4) {
      fputc(0x3b,__stream);
    }
    else {
      fwrite(" ->",3,1,__stream);
    }
  }
  fputc(10,__stream);
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  fwrite("{\n",2,1,__stream);
  fwrite("  rank = same;\n",0xf,1,__stream);
  fwrite("  LevelTitle1;\n",0xf,1,__stream);
  fwrite("  title1 [shape=plaintext,\n",0x1b,1,__stream);
  fwrite("          fontsize=20,\n",0x17,1,__stream);
  fwrite("          fontname = \"Times-Roman\",\n",0x24,1,__stream);
  fwrite("          label=\"",0x11,1,__stream);
  fputs("Network structure visualized by ABC",__stream);
  fwrite("\\n",2,1,__stream);
  fprintf(__stream,"Benchmark \\\"%s\\\". ",pNtk->pName);
  pcVar7 = Extra_TimeStamp();
  fprintf(__stream,"Time was %s. ",pcVar7);
  fwrite("\"\n",2,1,__stream);
  fwrite("         ];\n",0xc,1,__stream);
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  fwrite("{\n",2,1,__stream);
  fwrite("  rank = same;\n",0xf,1,__stream);
  fwrite("  LevelTitle2;\n",0xf,1,__stream);
  fwrite("  title2 [shape=plaintext,\n",0x1b,1,__stream);
  fwrite("          fontsize=18,\n",0x17,1,__stream);
  fwrite("          fontname = \"Times-Roman\",\n",0x24,1,__stream);
  fwrite("          label=\"",0x11,1,__stream);
  if (pNtk->nObjs == vNodes->nSize) {
    uVar4 = pNtk->nObjCounts[7];
    uVar10 = pNtk->nObjCounts[8];
    pcVar7 = "The network contains %d logic nodes and %d latches.";
  }
  else {
    uVar4 = Abc_NtkCountLogicNodes(vNodes);
    uVar10 = (uVar13 - uVar5) + 1;
    pcVar7 = "The set contains %d logic nodes and spans %d levels.";
  }
  fprintf(__stream,pcVar7,(ulong)uVar4,(ulong)uVar10);
  fwrite("\\n",2,1,__stream);
  fwrite("\"\n",2,1,__stream);
  fwrite("         ];\n",0xc,1,__stream);
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  if (local_5c != 0) {
    fwrite("{\n",2,1,__stream);
    fwrite("  rank = same;\n",0xf,1,__stream);
    fprintf(__stream,"  Level%d;\n",(ulong)uVar13);
    for (iVar2 = 0; iVar2 < vNodes->nSize; iVar2 = iVar2 + 1) {
      pAVar8 = (Abc_Obj_t *)Vec_PtrEntry(vNodes,iVar2);
      uVar4 = *(uint *)&pAVar8->field_0x14 & 0xf;
      if (0xfffffffd < uVar4 - 5) {
        uVar10 = pAVar8->Id;
        pAVar12 = pAVar8;
        if (uVar4 == 4) {
          pAVar12 = (Abc_Obj_t *)pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanouts).pArray];
        }
        pcVar9 = Abc_ObjName(pAVar12);
        pcVar7 = "T = %d\t\t";
        if ((*(uint *)&pAVar8->field_0x14 & 0xf) == 4) {
          pcVar7 = "mem_data_in";
        }
        fprintf(__stream,"  Node%d [label = \"%s%s\"",(ulong)uVar10,pcVar9,pcVar7 + 8);
        pcVar7 = "invtriangle";
        if ((*(uint *)&pAVar8->field_0x14 & 0xf) == 4) {
          pcVar7 = "box";
        }
        fprintf(__stream,", shape = %s",pcVar7);
        if ((pAVar8->field_0x14 & 0x20) != 0) {
          fwrite(", style = filled",0x10,1,__stream);
        }
        fwrite(", color = coral, fillcolor = coral",0x22,1,__stream);
        fwrite("];\n",3,1,__stream);
      }
    }
    fputc(0x7d,__stream);
    fputc(10,__stream);
    fputc(10,__stream);
  }
  for (uVar4 = uVar13 - local_5c; ((int)uVar5 <= (int)uVar4 && (0 < (int)uVar4)); uVar4 = uVar4 - 1)
  {
    fwrite("{\n",2,1,__stream);
    fwrite("  rank = same;\n",0xf,1,__stream);
    fprintf(__stream,"  Level%d;\n",(ulong)uVar4);
    for (iVar2 = 0; iVar2 < vNodes->nSize; iVar2 = iVar2 + 1) {
      pvVar6 = Vec_PtrEntry(vNodes,iVar2);
      if ((*(uint *)((long)pvVar6 + 0x14) >> 0xc == uVar4) && (*(int *)((long)pvVar6 + 0x1c) != 0))
      {
        pcVar7 = "";
        if (pNtk->ntkType != ABC_NTK_STRASH) {
          pGate = *(Mio_Gate_t **)((long)pvVar6 + 0x38);
          if (pNtk->ntkFunc == ABC_FUNC_MAP && fGateNames != 0) {
            pcVar7 = Mio_GateReadName(pGate);
          }
          else {
            if (pNtk->ntkFunc == ABC_FUNC_MAP) {
              pGate = (Mio_Gate_t *)Mio_GateReadSop(pGate);
            }
            Abc_NtkPrintSop((char *)pGate);
            pcVar7 = Abc_NtkPrintSop::Buffer;
          }
        }
        fprintf(__stream,"  Node%d [label = \"%d\\n%s\"",(ulong)*(uint *)((long)pvVar6 + 0x10),
                (ulong)*(uint *)((long)pvVar6 + 0x10),pcVar7);
        fwrite(", shape = ellipse",0x11,1,__stream);
        if ((*(byte *)((long)pvVar6 + 0x14) & 0x20) != 0) {
          fwrite(", style = filled",0x10,1,__stream);
        }
        fwrite("];\n",3,1,__stream);
      }
    }
    fputc(0x7d,__stream);
    fputc(10,__stream);
    fputc(10,__stream);
  }
  if (uVar5 == 0) {
    fwrite("{\n",2,1,__stream);
    fwrite("  rank = same;\n",0xf,1,__stream);
    fprintf(__stream,"  Level%d;\n",0);
    for (iVar2 = 0; iVar2 < vNodes->nSize; iVar2 = iVar2 + 1) {
      pAVar8 = (Abc_Obj_t *)Vec_PtrEntry(vNodes,iVar2);
      uVar5 = *(uint *)&pAVar8->field_0x14 & 0xf;
      if ((uVar5 == 2) || (uVar5 == 5)) {
        uVar4 = pAVar8->Id;
        pAVar12 = pAVar8;
        if (uVar5 == 5) {
          pAVar12 = (Abc_Obj_t *)pAVar8->pNtk->vObjs->pArray[*(pAVar8->vFanins).pArray];
        }
        pcVar7 = Abc_ObjName(pAVar12);
        fprintf(__stream,"  Node%d [label = \"%s\"",(ulong)uVar4,pcVar7);
        pcVar7 = ", shape = triangle";
        if ((*(uint *)&pAVar8->field_0x14 & 0xf) == 5) {
          pcVar7 = ", shape = box";
        }
        fprintf(__stream,", shape = %s",pcVar7 + 10);
LAB_002ea904:
        if ((pAVar8->field_0x14 & 0x20) != 0) {
          fwrite(", style = filled",0x10,1,__stream);
        }
        fwrite(", color = coral, fillcolor = coral",0x22,1,__stream);
        fwrite("];\n",3,1,__stream);
      }
      else if (((pAVar8->vFanins).nSize == 0) && (0 < (pAVar8->vFanouts).nSize)) {
        uVar5 = pAVar8->Id;
        uVar11 = 1;
        if (pAVar8->pNtk->ntkType != ABC_NTK_STRASH) {
          iVar3 = Abc_NodeIsConst1(pAVar8);
          uVar11 = (ulong)(iVar3 != 0);
        }
        fprintf(__stream,"  Node%d [label = \"Const%d\"",(ulong)uVar5,uVar11);
        fwrite(", shape = ellipse",0x11,1,__stream);
        goto LAB_002ea904;
      }
    }
    fputc(0x7d,__stream);
    fputc(10,__stream);
    fputc(10,__stream);
  }
  fwrite("title1 -> title2 [style = invis];\n",0x22,1,__stream);
  for (iVar2 = 0; iVar3 = vNodes->nSize, iVar2 < iVar3; iVar2 = iVar2 + 1) {
    pvVar6 = Vec_PtrEntry(vNodes,iVar2);
    if (*(uint *)((long)pvVar6 + 0x14) >> 0xc == uVar13) {
      fprintf(__stream,"title2 -> Node%d [style = invis];\n",(ulong)*(uint *)((long)pvVar6 + 0x10));
    }
  }
  uVar5 = 0xffffffff;
  for (iVar2 = 0; iVar2 < iVar3; iVar2 = iVar2 + 1) {
    pvVar6 = Vec_PtrEntry(vNodes,iVar2);
    if ((*(uint *)((long)pvVar6 + 0x14) & 0xf) == 3 &&
        *(uint *)((long)pvVar6 + 0x14) >> 0xc == uVar13) {
      if (-1 < (int)uVar5) {
        fprintf(__stream,"Node%d -> Node%d [style = invis];\n",(ulong)uVar5,
                (ulong)*(uint *)((long)pvVar6 + 0x10));
      }
      uVar5 = *(uint *)((long)pvVar6 + 0x10);
    }
    iVar3 = vNodes->nSize;
  }
  for (iVar2 = 0; iVar2 < iVar3; iVar2 = iVar2 + 1) {
    pAVar8 = (Abc_Obj_t *)Vec_PtrEntry(vNodes,iVar2);
    if ((*(uint *)&pAVar8->field_0x14 & 0xf) != 8) {
      for (lVar14 = 0; lVar14 < (pAVar8->vFanins).nSize; lVar14 = lVar14 + 1) {
        pvVar6 = pAVar8->pNtk->vObjs->pArray[(pAVar8->vFanins).pArray[lVar14]];
        if ((*(uint *)((long)pvVar6 + 0x14) & 0xf) != 8) {
          pcVar7 = "solid";
          if (pNtk->ntkType == ABC_NTK_STRASH) {
            iVar3 = Abc_ObjFaninC(pAVar8,(int)lVar14);
            pcVar7 = "dotted";
            if (iVar3 == 0) {
              pcVar7 = "solid";
            }
          }
          fprintf(__stream,"Node%d",(ulong)(uint)pAVar8->Id);
          fwrite(" -> ",4,1,__stream);
          fprintf(__stream,"Node%d",(ulong)*(uint *)((long)pvVar6 + 0x10));
          fprintf(__stream," [style = %s",pcVar7);
          fputc(0x5d,__stream);
          fwrite(";\n",2,1,__stream);
        }
      }
    }
    iVar3 = vNodes->nSize;
  }
  fputc(0x7d,__stream);
  fputc(10,__stream);
  fputc(10,__stream);
  fclose(__stream);
  for (iVar2 = 0; iVar2 < vNodes->nSize; iVar2 = iVar2 + 1) {
    pvVar6 = Vec_PtrEntry(vNodes,iVar2);
    *(byte *)((long)pvVar6 + 0x14) = *(byte *)((long)pvVar6 + 0x14) & 0xbf;
  }
  if (vNodesShow != (Vec_Ptr_t *)0x0) {
    for (iVar2 = 0; iVar2 < vNodesShow->nSize; iVar2 = iVar2 + 1) {
      pvVar6 = Vec_PtrEntry(vNodesShow,iVar2);
      *(byte *)((long)pvVar6 + 0x14) = *(byte *)((long)pvVar6 + 0x14) & 0xdf;
    }
  }
  if (!bVar1) {
    Abc_NtkSopToBdd(pNtk);
    return;
  }
  return;
}

Assistant:

void Io_WriteDotNtk( Abc_Ntk_t * pNtk, Vec_Ptr_t * vNodes, Vec_Ptr_t * vNodesShow, char * pFileName, int fGateNames, int fUseReverse )
{
    FILE * pFile;
    Abc_Obj_t * pNode, * pFanin;
    char * pSopString;
    int LevelMin, LevelMax, fHasCos, Level, i, k, fHasBdds, fCompl, Prev;
    int Limit = 500;

    assert( Abc_NtkIsStrash(pNtk) || Abc_NtkIsLogic(pNtk) );

    if ( vNodes->nSize < 1 )
    {
        printf( "The set has no nodes. DOT file is not written.\n" );
        return;
    }

    if ( vNodes->nSize > Limit )
    {
        printf( "The set has more than %d nodes. DOT file is not written.\n", Limit );
        return;
    }

    // start the stream
    if ( (pFile = fopen( pFileName, "w" )) == NULL )
    {
        fprintf( stdout, "Cannot open the intermediate file \"%s\".\n", pFileName );
        return;
    }

    // transform logic functions from BDD to SOP
    if ( (fHasBdds = Abc_NtkIsBddLogic(pNtk)) )
    {
        if ( !Abc_NtkBddToSop(pNtk, -1, ABC_INFINITY) )
        {
            printf( "Io_WriteDotNtk(): Converting to SOPs has failed.\n" );
            return;
        }
    }

    // mark the nodes from the set
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        pNode->fMarkC = 1;
    if ( vNodesShow )
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodesShow, pNode, i )
            pNode->fMarkB = 1;

    // get the levels of nodes
    LevelMax = Abc_NtkLevel( pNtk );
    if ( fUseReverse )
    {
        LevelMin = Abc_NtkLevelReverse( pNtk );
        assert( LevelMax == LevelMin );
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
            if ( Abc_ObjIsNode(pNode) )
                pNode->Level = LevelMax - pNode->Level + 1;
    }

    // find the largest and the smallest levels
    LevelMin = 10000;
    LevelMax = -1;
    fHasCos  = 0;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( Abc_ObjIsCo(pNode) )
        {
            fHasCos = 1;
            continue;
        }
        if ( LevelMin > (int)pNode->Level )
            LevelMin = pNode->Level;
        if ( LevelMax < (int)pNode->Level )
            LevelMax = pNode->Level;
    }

    // set the level of the CO nodes
    if ( fHasCos )
    {
        LevelMax++;
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        {
            if ( Abc_ObjIsCo(pNode) )
                pNode->Level = LevelMax;
        }
    }

    // write the DOT header
    fprintf( pFile, "# %s\n",  "Network structure generated by ABC" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "digraph network {\n" );
    fprintf( pFile, "size = \"7.5,10\";\n" );
//    fprintf( pFile, "size = \"10,8.5\";\n" );
//    fprintf( pFile, "size = \"14,11\";\n" );
//    fprintf( pFile, "page = \"8,11\";\n" );
//  fprintf( pFile, "ranksep = 0.5;\n" );
//  fprintf( pFile, "nodesep = 0.5;\n" );
    fprintf( pFile, "center = true;\n" );
//    fprintf( pFile, "orientation = landscape;\n" );
//  fprintf( pFile, "edge [fontsize = 10];\n" );
//  fprintf( pFile, "edge [dir = none];\n" );
    fprintf( pFile, "edge [dir = back];\n" );
    fprintf( pFile, "\n" );

    // labels on the left of the picture
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  node [shape = plaintext];\n" );
    fprintf( pFile, "  edge [style = invis];\n" );
    fprintf( pFile, "  LevelTitle1 [label=\"\"];\n" );
    fprintf( pFile, "  LevelTitle2 [label=\"\"];\n" );
    // generate node names with labels
    for ( Level = LevelMax; Level >= LevelMin; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d", Level );
        fprintf( pFile, " [label = " );
        // label name
        fprintf( pFile, "\"" );
        fprintf( pFile, "\"" );
        fprintf( pFile, "];\n" );
    }

    // genetate the sequence of visible/invisible nodes to mark levels
    fprintf( pFile, "  LevelTitle1 ->  LevelTitle2 ->" );
    for ( Level = LevelMax; Level >= LevelMin; Level-- )
    {
        // the visible node name
        fprintf( pFile, "  Level%d",  Level );
        // the connector
        if ( Level != LevelMin )
            fprintf( pFile, " ->" );
        else
            fprintf( pFile, ";" );
    }
    fprintf( pFile, "\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate title box on top
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle1;\n" );
    fprintf( pFile, "  title1 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=20,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    fprintf( pFile, "%s", "Network structure visualized by ABC" );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "Benchmark \\\"%s\\\". ", pNtk->pName );
    fprintf( pFile, "Time was %s. ",  Extra_TimeStamp() );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate statistics box
    fprintf( pFile, "{\n" );
    fprintf( pFile, "  rank = same;\n" );
    fprintf( pFile, "  LevelTitle2;\n" );
    fprintf( pFile, "  title2 [shape=plaintext,\n" );
    fprintf( pFile, "          fontsize=18,\n" );
    fprintf( pFile, "          fontname = \"Times-Roman\",\n" );
    fprintf( pFile, "          label=\"" );
    if ( Abc_NtkObjNum(pNtk) == Vec_PtrSize(vNodes) )
        fprintf( pFile, "The network contains %d logic nodes and %d latches.", Abc_NtkNodeNum(pNtk), Abc_NtkLatchNum(pNtk) );
    else
        fprintf( pFile, "The set contains %d logic nodes and spans %d levels.", Abc_NtkCountLogicNodes(vNodes), LevelMax - LevelMin + 1 );
    fprintf( pFile, "\\n" );
    fprintf( pFile, "\"\n" );
    fprintf( pFile, "         ];\n" );
    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );

    // generate the POs
    if ( fHasCos )
    {
        fprintf( pFile, "{\n" );
        fprintf( pFile, "  rank = same;\n" );
        // the labeling node of this level
        fprintf( pFile, "  Level%d;\n",  LevelMax );
        // generate the PO nodes
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        {
            if ( !Abc_ObjIsCo(pNode) )
                continue;
            fprintf( pFile, "  Node%d [label = \"%s%s\"", 
                pNode->Id, 
                (Abc_ObjIsBi(pNode)? Abc_ObjName(Abc_ObjFanout0(pNode)):Abc_ObjName(pNode)), 
                (Abc_ObjIsBi(pNode)? "_in":"") );
            fprintf( pFile, ", shape = %s", (Abc_ObjIsBi(pNode)? "box":"invtriangle") );
            if ( pNode->fMarkB )
                fprintf( pFile, ", style = filled" );
            fprintf( pFile, ", color = coral, fillcolor = coral" );
            fprintf( pFile, "];\n" );
        }
        fprintf( pFile, "}" );
        fprintf( pFile, "\n" );
        fprintf( pFile, "\n" );
    }

    // generate nodes of each rank
    for ( Level = LevelMax - fHasCos; Level >= LevelMin && Level > 0; Level-- )
    {
        fprintf( pFile, "{\n" );
        fprintf( pFile, "  rank = same;\n" );
        // the labeling node of this level
        fprintf( pFile, "  Level%d;\n",  Level );
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        {
            if ( (int)pNode->Level != Level )
                continue;
            if ( Abc_ObjFaninNum(pNode) == 0 )
                continue;

/*
            int SuppSize;
            Vec_Ptr_t * vSupp;
            if ( (int)pNode->Level != Level )
                continue;
            if ( Abc_ObjFaninNum(pNode) == 0 )
                continue;
            vSupp = Abc_NtkNodeSupport( pNtk, &pNode, 1 );
            SuppSize = Vec_PtrSize( vSupp );
            Vec_PtrFree( vSupp ); 
*/

//            fprintf( pFile, "  Node%d [label = \"%d\"", pNode->Id, pNode->Id );
            if ( Abc_NtkIsStrash(pNtk) )
                pSopString = "";
            else if ( Abc_NtkHasMapping(pNtk) && fGateNames )
                pSopString = Mio_GateReadName((Mio_Gate_t *)pNode->pData);
            else if ( Abc_NtkHasMapping(pNtk) )
                pSopString = Abc_NtkPrintSop(Mio_GateReadSop((Mio_Gate_t *)pNode->pData));
            else
                pSopString = Abc_NtkPrintSop((char *)pNode->pData);
            fprintf( pFile, "  Node%d [label = \"%d\\n%s\"", pNode->Id, pNode->Id, pSopString );
//            fprintf( pFile, "  Node%d [label = \"%d\\n%s\"", pNode->Id, 
//                SuppSize, 
//                pSopString );

            fprintf( pFile, ", shape = ellipse" );
            if ( pNode->fMarkB )
                fprintf( pFile, ", style = filled" );
            fprintf( pFile, "];\n" );
        }
        fprintf( pFile, "}" );
        fprintf( pFile, "\n" );
        fprintf( pFile, "\n" );
    }

    // generate the PI nodes if any
    if ( LevelMin == 0 )
    {
        fprintf( pFile, "{\n" );
        fprintf( pFile, "  rank = same;\n" );
        // the labeling node of this level
        fprintf( pFile, "  Level%d;\n",  LevelMin );
        // generate the PO nodes
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        {
            if ( !Abc_ObjIsCi(pNode) )
            {
                // check if the costant node is present
                if ( Abc_ObjFaninNum(pNode) == 0 && Abc_ObjFanoutNum(pNode) > 0 )
                {
                    fprintf( pFile, "  Node%d [label = \"Const%d\"", pNode->Id, Abc_NtkIsStrash(pNode->pNtk) || Abc_NodeIsConst1(pNode) );
                    fprintf( pFile, ", shape = ellipse" );
                    if ( pNode->fMarkB )
                        fprintf( pFile, ", style = filled" );
                    fprintf( pFile, ", color = coral, fillcolor = coral" );
                    fprintf( pFile, "];\n" );
                }
                continue;
            }
            fprintf( pFile, "  Node%d [label = \"%s\"", 
                pNode->Id, 
                (Abc_ObjIsBo(pNode)? Abc_ObjName(Abc_ObjFanin0(pNode)):Abc_ObjName(pNode)) );
            fprintf( pFile, ", shape = %s", (Abc_ObjIsBo(pNode)? "box":"triangle") );
            if ( pNode->fMarkB )
                fprintf( pFile, ", style = filled" );
            fprintf( pFile, ", color = coral, fillcolor = coral" );
            fprintf( pFile, "];\n" );
        }
        fprintf( pFile, "}" );
        fprintf( pFile, "\n" );
        fprintf( pFile, "\n" );
    }

    // generate invisible edges from the square down
    fprintf( pFile, "title1 -> title2 [style = invis];\n" );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( (int)pNode->Level != LevelMax )
            continue;
        fprintf( pFile, "title2 -> Node%d [style = invis];\n", pNode->Id );
    }
    // generate invisible edges among the COs
    Prev = -1;
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( (int)pNode->Level != LevelMax )
            continue;
        if ( !Abc_ObjIsPo(pNode) )
            continue;
        if ( Prev >= 0 )
            fprintf( pFile, "Node%d -> Node%d [style = invis];\n", Prev, pNode->Id );
        Prev = pNode->Id;
    }

    // generate edges
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        if ( Abc_ObjIsLatch(pNode) )
            continue;
        Abc_ObjForEachFanin( pNode, pFanin, k )
        {
            if ( Abc_ObjIsLatch(pFanin) )
                continue;
            fCompl = 0;
            if ( Abc_NtkIsStrash(pNtk) )
                fCompl = Abc_ObjFaninC(pNode, k);
            // generate the edge from this node to the next
            fprintf( pFile, "Node%d",  pNode->Id );
            fprintf( pFile, " -> " );
            fprintf( pFile, "Node%d",  pFanin->Id );
            fprintf( pFile, " [style = %s", fCompl? "dotted" : "solid" );
//            fprintf( pFile, ", label = \"%c\"", 'a' + k );
            fprintf( pFile, "]" );
            fprintf( pFile, ";\n" );
        }
    }

    fprintf( pFile, "}" );
    fprintf( pFile, "\n" );
    fprintf( pFile, "\n" );
    fclose( pFile );

    // unmark the nodes from the set
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
        pNode->fMarkC = 0;
    if ( vNodesShow )
        Vec_PtrForEachEntry( Abc_Obj_t *, vNodesShow, pNode, i )
            pNode->fMarkB = 0;

    // convert the network back into BDDs if this is how it was
    if ( fHasBdds )
        Abc_NtkSopToBdd(pNtk);
}